

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colourblock.cpp
# Opt level: O1

void squish::DecompressColour(u8 *rgba,void *block,bool isDxt1)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int i;
  long lVar4;
  byte bVar5;
  byte abStack_44 [4];
  byte abStack_40 [4];
  undefined1 auStack_3c [4];
  byte local_38 [7];
  undefined1 local_31;
  undefined1 auStack_30 [3];
  undefined1 local_2d;
  byte abStack_2c [3];
  char local_29;
  u8 codes [16];
  u8 indices [16];
  
  bVar5 = *(byte *)((long)block + 1);
  uVar2 = *block;
  local_38[0] = bVar5 & 0xf8 | bVar5 >> 5;
  local_38[1] = bVar5 >> 1 & 3 | (byte)(uVar2 >> 3) & 0xfc;
  local_38[2] = *block >> 2 & 7 | *block * '\b';
  local_38[3] = 0xff;
  bVar5 = *(byte *)((long)block + 2);
  bVar1 = *(byte *)((long)block + 3);
  uVar3 = *(ushort *)((long)block + 2);
  local_38[4] = bVar1 & 0xf8 | bVar1 >> 5;
  local_38[5] = bVar1 >> 1 & 3 | (byte)(uVar3 >> 3) & 0xfc;
  local_38[6] = bVar5 >> 2 & 7 | bVar5 * '\b';
  local_31 = 0xff;
  lVar4 = 0xc;
  do {
    bVar5 = abStack_44[lVar4];
    bVar1 = abStack_40[lVar4];
    if (uVar3 < uVar2 || !isDxt1) {
      auStack_3c[lVar4] = (char)((ulong)((uint)bVar1 + (uint)bVar5 * 2) * 0x55555556 >> 0x20);
      bVar5 = (byte)(((uint)bVar5 + (uint)bVar1 * 2) / 3);
    }
    else {
      auStack_3c[lVar4] = (char)((uint)bVar1 + (uint)bVar5 >> 1);
      bVar5 = 0;
    }
    local_38[lVar4] = bVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xf);
  local_2d = 0xff;
  local_29 = -(~isDxt1 & 1U | uVar3 < uVar2);
  lVar4 = 0;
  do {
    bVar5 = *(byte *)((long)block + lVar4 + 4);
    codes[lVar4 * 4] = bVar5 & 3;
    codes[lVar4 * 4 + 1] = bVar5 >> 2 & 3;
    codes[lVar4 * 4 + 2] = bVar5 >> 4 & 3;
    codes[lVar4 * 4 + 3] = bVar5 >> 6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(undefined4 *)(rgba + lVar4 * 4) = *(undefined4 *)(local_38 + (byte)(codes[lVar4] << 2));
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  return;
}

Assistant:

static int Unpack565( u8 const* packed, u8* colour )
{
	// build the packed value
	int value = ( int )packed[0] | ( ( int )packed[1] << 8 );
	
	// get the components in the stored range
	u8 red = ( u8 )( ( value >> 11 ) & 0x1f );
	u8 green = ( u8 )( ( value >> 5 ) & 0x3f );
	u8 blue = ( u8 )( value & 0x1f );

	// scale up to 8 bits
	colour[0] = ( red << 3 ) | ( red >> 2 );
	colour[1] = ( green << 2 ) | ( green >> 4 );
	colour[2] = ( blue << 3 ) | ( blue >> 2 );
	colour[3] = 255;
	
	// return the value
	return value;
}